

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_file_server.cpp
# Opt level: O3

void cppcms::impl::file_server::normalize_path(string *path)

{
  char *pcVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  char *pcVar3;
  size_type sVar4;
  ptrdiff_t _Num;
  size_t __n;
  char *pcVar5;
  char *__dest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar4 = path->_M_string_length;
  if ((sVar4 == 0) || (pcVar3 = (path->_M_dataplus)._M_p, *pcVar3 != '/')) {
    std::operator+(&local_50,"/",path);
    std::__cxx11::string::operator=((string *)path,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_) !=
        &local_50.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_));
    }
    pcVar3 = (path->_M_dataplus)._M_p;
    sVar4 = path->_M_string_length;
  }
  pcVar5 = pcVar3 + 1;
  __dest = pcVar5;
  if (1 < (long)sVar4) {
    pcVar1 = pcVar3 + sVar4;
    do {
      local_50._M_dataplus._M_p._0_1_ = 0x2f;
      _Var2 = std::
              __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (pcVar5,pcVar1,&local_50);
      __n = (long)_Var2._M_current - (long)pcVar5;
      if (__n != 0) {
        if (__n == 2) {
          if ((*pcVar5 != '.') || (pcVar5[1] != '.')) goto LAB_001ea6df;
          pcVar5 = (path->_M_dataplus)._M_p + 1;
          pcVar3 = __dest + -(ulong)(pcVar5 < __dest);
          do {
            __dest = pcVar3;
            if (pcVar3 <= pcVar5) break;
            __dest = pcVar3 + -1;
            pcVar1 = pcVar3 + -1;
            pcVar3 = __dest;
          } while (*pcVar1 != '/');
        }
        else if ((__n != 1) || (*pcVar5 != '.')) {
LAB_001ea6df:
          memmove(__dest,pcVar5,__n);
          __dest = __dest + __n;
          if (_Var2._M_current != (path->_M_dataplus)._M_p + path->_M_string_length) {
            *__dest = '/';
            __dest = __dest + 1;
          }
        }
      }
      pcVar3 = (path->_M_dataplus)._M_p;
      pcVar1 = pcVar3 + path->_M_string_length;
    } while ((_Var2._M_current != pcVar1) && (pcVar5 = _Var2._M_current + 1, pcVar5 < pcVar1));
  }
  pcVar5 = __dest + -1;
  if (__dest <= pcVar3 + 1) {
    pcVar5 = __dest;
  }
  if (__dest[-1] != '/') {
    pcVar5 = __dest;
  }
  std::__cxx11::string::resize((ulong)path,(char)pcVar5 - (char)pcVar3);
  return;
}

Assistant:

void file_server::normalize_path(std::string &path)
{
#ifdef CPPCMS_WIN32
	for(size_t i=0;i<path.size();i++)
		if(path[i]=='\\')
			path[i]='/';
#endif
	if(path.empty() || path[0]!='/')
		path = "/" + path;
	
	std::string::iterator out = path.begin() + 1;
	std::string::iterator start = path.begin() + 1;
	while(start < path.end()) {
		std::string::iterator end = std::find(start,path.end(),'/');
		if(end==start || (end-start == 1 && *start == '.')) { // case of "//" and "/./"
			// nothing to do
		}
		else if(end-start == 2 && *start == '.' && *(start+1) == '.') {
			std::string::iterator min_pos = path.begin() + 1;
			if(out > min_pos)
				out --;
			while(out > min_pos) {
				out --;
				if(*out == '/')
					break;
			}
		}
		else {
			out = std::copy(start,end,out);
			if(end != path.end())
				*out++ = '/';
		}
		if(end == path.end())
			break;
		start = end;
		++start;
	}
	if(*(out-1) == '/' && out > path.begin()+1)
		out--;
	path.resize(out - path.begin());
}